

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzverysparsematrix.h
# Opt level: O1

complex<double> * __thiscall
TPZVerySparseMatrix<std::complex<double>_>::s
          (TPZVerySparseMatrix<std::complex<double>_> *this,int64_t row,int64_t col)

{
  mapped_type *pmVar1;
  key_type local_10;
  
  local_10.first = row;
  local_10.second = col;
  pmVar1 = std::
           map<std::pair<long,_long>,_std::complex<double>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::complex<double>_>_>_>
           ::operator[](&this->fExtraSparseData,&local_10);
  return pmVar1;
}

Assistant:

virtual TVar &s(const int64_t row, const int64_t col) override
	{
#ifdef PZDEBUG
		if(row >= this->Rows() || row<0 || col >= this->Cols() || col<0)
		{
			this->Error("TPZFMatrix::operator() "," Index out of bounds");
			DebugStop();
		}
#endif
		return fExtraSparseData[std::pair<int64_t, int64_t>(row, col)];
	}